

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double_to_string_tests.cpp
# Opt level: O0

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
float_to_string<wchar_t>(double val,int precision)

{
  container_type *in_RDI;
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  writer;
  write_double print;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s;
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *in_stack_00000200;
  double in_stack_00000208;
  write_double *in_stack_00000210;
  int in_stack_ffffffffffffff98;
  float_chars_format in_stack_ffffffffffffff9f;
  write_double *in_stack_ffffffffffffffa0;
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_58;
  undefined1 local_49;
  
  jsoncons::detail::write_double::write_double
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98);
  local_49 = 0;
  std::__cxx11::wstring::wstring((wstring *)in_RDI);
  jsoncons::
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::string_sink(&local_58,in_RDI);
  jsoncons::detail::write_double::operator()(in_stack_00000210,in_stack_00000208,in_stack_00000200);
  jsoncons::
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::flush(&local_58);
  local_49 = 1;
  jsoncons::detail::write_double::~write_double((write_double *)0x9c60f8);
  return in_RDI;
}

Assistant:

std::basic_string<CharT> float_to_string(double val, int precision)
{
    jsoncons::detail::write_double print(float_chars_format::general,precision);

    std::basic_string<CharT> s;
    jsoncons::string_sink<std::basic_string<CharT>> writer(s);
    print(val, writer);
    writer.flush();
    return s;
}